

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O2

double atan2(double __y,double __x)

{
  uint sz;
  double *pdVar1;
  ulong uVar2;
  double *in_RDX;
  double *in_RSI;
  Fad<double> *in_RDI;
  ulong uVar3;
  double dVar4;
  STATE angle;
  double local_28;
  
  sz = *(uint *)(in_RDX + 1);
  local_28 = atan2(*in_RSI,*in_RDX);
  Fad<double>::Fad(in_RDI,sz,&local_28);
  dVar4 = *in_RDX * *in_RDX + *in_RSI * *in_RSI;
  pdVar1 = (in_RDI->dx_).ptr_to_data;
  uVar2 = 0;
  uVar3 = (ulong)sz;
  if ((int)sz < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pdVar1[uVar2] =
         (*in_RDX * *(double *)((long)in_RSI[2] + uVar2 * 8) -
         *in_RSI * *(double *)((long)in_RDX[2] + uVar2 * 8)) / dVar4;
  }
  return dVar4;
}

Assistant:

static Fad<STATE> atan2(Fad<STATE> y, Fad<STATE> x)
{
    int sz = x.size();
    STATE xval,yval;
    xval = x.val();
    yval = y.val();
    STATE angle = atan2(yval,xval);
    Fad<STATE> result(sz,angle);
    STATE r = x.val()*x.val()+y.val()*y.val();
    for (int i=0; i<sz; i++) {
        result.fastAccessDx(i) = (-y.val()*x.fastAccessDx(i) + x.val()*y.fastAccessDx(i))/r;
    }
    return result;
}